

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  byte bVar1;
  int a_00;
  long lVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  stbi_uc *psVar8;
  long lVar9;
  void *__ptr;
  byte *pbVar10;
  long lVar11;
  byte bVar12;
  char *pcVar13;
  size_t __n;
  size_t sVar14;
  byte bVar15;
  size_t __n_00;
  ushort *puVar16;
  ulong uVar17;
  ulong uVar18;
  byte *pbVar19;
  uint uVar20;
  uint uVar21;
  stbi_uc *dest;
  char cVar22;
  byte bVar23;
  uint uVar24;
  stbi__uint32 sVar25;
  uint uVar26;
  byte *__src;
  ulong uVar27;
  ushort *src;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  long *in_FS_OFFSET;
  bool bVar31;
  
  bVar31 = depth == 0x10;
  iVar5 = x * out_n << bVar31;
  a_00 = a->s->img_n;
  uVar6 = a_00 << bVar31;
  psVar8 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar31,0);
  a->out = psVar8;
  if (psVar8 == (stbi_uc *)0x0) {
    *(char **)(*in_FS_OFFSET + -0x20) = "outofmem";
    return 0;
  }
  iVar7 = stbi__mad3sizes_valid(a_00,x,depth,7);
  if (iVar7 != 0) {
    uVar28 = a_00 * x;
    uVar24 = uVar28 * depth + 7 >> 3;
    if ((int)y < 0) {
      bVar31 = true;
    }
    else if (y == 0) {
      bVar31 = false;
    }
    else {
      bVar31 = (uint)(0x7fffffff / (ulong)y) < uVar24;
    }
    if ((!bVar31) && ((int)(uVar24 * y) <= (int)(uVar24 ^ 0x7fffffff))) {
      if (raw_len < (uVar24 + 1) * y) {
        lVar9 = *in_FS_OFFSET;
        pcVar13 = "not enough pixels";
      }
      else {
        __ptr = malloc((ulong)(uVar24 * 2));
        if (__ptr != (void *)0x0) {
          uVar26 = 1;
          if (depth < 8) {
            uVar6 = 1;
          }
          if (y != 0) {
            sVar25 = x;
            if (depth < 8) {
              sVar25 = uVar24;
            }
            uVar26 = sVar25 * uVar6;
            lVar2 = *in_FS_OFFSET;
            __n = (size_t)(int)uVar6;
            __n_00 = (size_t)(int)uVar26;
            lVar9 = __n + 1;
            bVar4 = 1;
            bVar23 = 1;
            uVar29 = 0;
            uVar27 = 0;
            do {
              uVar18 = 0;
              if ((uVar27 & 1) != 0) {
                uVar18 = (ulong)uVar24;
              }
              uVar30 = (ulong)uVar29;
              __src = raw + 1;
              bVar1 = *raw;
              uVar17 = (ulong)bVar1;
              if (uVar17 < 5) {
                if (uVar27 == 0) {
                  uVar17 = (ulong)""[uVar17];
                }
                src = (ushort *)(uVar18 + (long)__ptr);
                psVar8 = a->out;
                if ((byte)uVar17 < 6) {
                  uVar18 = (ulong)((bVar23 & 1) * uVar24);
                  pbVar10 = (byte *)((long)__ptr + uVar18);
                  switch(uVar17) {
                  case 0:
                    memcpy(src,__src,__n_00);
                    break;
                  case 1:
                    memcpy(src,__src,__n);
                    if ((int)uVar6 < (int)uVar26) {
                      lVar11 = 0;
                      do {
                        *(byte *)((long)src + lVar11 + __n) =
                             *(byte *)((long)src + lVar11) + raw[lVar11 + lVar9];
                        lVar11 = lVar11 + 1;
                      } while ((__n - __n_00) + lVar11 != 0);
                    }
                    break;
                  case 2:
                    if (0 < (int)uVar26) {
                      uVar18 = 0;
                      do {
                        *(byte *)((long)src + uVar18) = pbVar10[uVar18] + __src[uVar18];
                        uVar18 = uVar18 + 1;
                      } while (uVar26 != uVar18);
                    }
                    break;
                  case 3:
                    if (0 < (int)uVar6) {
                      uVar17 = 0;
                      do {
                        *(byte *)((long)src + uVar17) = (pbVar10[uVar17] >> 1) + __src[uVar17];
                        uVar17 = uVar17 + 1;
                      } while (uVar6 != uVar17);
                    }
                    if ((int)uVar6 < (int)uVar26) {
                      pbVar10 = (byte *)((long)__ptr + uVar18 + __n);
                      pbVar19 = raw + lVar9;
                      sVar14 = __n_00;
                      puVar16 = src;
                      do {
                        *(byte *)((long)puVar16 + __n) =
                             (char)((uint)(byte)*puVar16 + (uint)*pbVar10 >> 1) + *pbVar19;
                        puVar16 = (ushort *)((long)puVar16 + 1);
                        pbVar19 = pbVar19 + 1;
                        pbVar10 = pbVar10 + 1;
                        sVar14 = sVar14 - 1;
                      } while (__n != sVar14);
                    }
                    break;
                  case 4:
                    if (0 < (int)uVar6) {
                      uVar18 = 0;
                      do {
                        *(byte *)((long)src + uVar18) = pbVar10[uVar18] + __src[uVar18];
                        uVar18 = uVar18 + 1;
                      } while (uVar6 != uVar18);
                    }
                    if ((int)uVar6 < (int)uVar26) {
                      pbVar19 = raw + lVar9;
                      sVar14 = __n_00;
                      puVar16 = src;
                      do {
                        bVar12 = (byte)*puVar16;
                        bVar15 = *pbVar10;
                        uVar20 = (uint)bVar12;
                        iVar7 = (((uint)bVar15 + (uint)bVar15 * 2) - (uint)pbVar10[__n]) - uVar20;
                        uVar21 = (uint)pbVar10[__n];
                        uVar3 = uVar21;
                        if (uVar20 < uVar21) {
                          uVar3 = (uint)bVar12;
                        }
                        if (uVar21 < uVar20) {
                          uVar21 = (uint)bVar12;
                        }
                        uVar20 = (uint)bVar15;
                        if ((int)uVar21 <= iVar7) {
                          uVar20 = uVar3;
                        }
                        cVar22 = (char)uVar20;
                        if (iVar7 <= (int)uVar3) {
                          cVar22 = (char)uVar21;
                        }
                        *(byte *)((long)puVar16 + __n) = cVar22 + *pbVar19;
                        puVar16 = (ushort *)((long)puVar16 + 1);
                        pbVar10 = pbVar10 + 1;
                        pbVar19 = pbVar19 + 1;
                        sVar14 = sVar14 - 1;
                      } while (__n != sVar14);
                    }
                    break;
                  case 5:
                    memcpy(src,__src,__n);
                    if ((int)uVar6 < (int)uVar26) {
                      lVar11 = 0;
                      do {
                        *(byte *)((long)src + lVar11 + __n) =
                             (*(byte *)((long)src + lVar11) >> 1) + raw[lVar11 + lVar9];
                        lVar11 = lVar11 + 1;
                      } while ((__n - __n_00) + lVar11 != 0);
                    }
                  }
                }
                dest = psVar8 + (uint)(iVar5 * (int)uVar27);
                __src = __src + __n_00;
                if (depth < 8) {
                  bVar12 = 1;
                  if (color == 0) {
                    bVar12 = ""[depth];
                  }
                  if (depth == 4) {
                    if (uVar28 != 0) {
                      uVar18 = 0;
                      uVar17 = 0;
                      do {
                        if ((uVar18 & 1) == 0) {
                          uVar17 = (ulong)(byte)*src;
                          src = (ushort *)((long)src + 1);
                        }
                        psVar8[uVar18 + uVar30] = (char)(uVar17 >> 4) * bVar12;
                        uVar17 = (ulong)(byte)((char)uVar17 << 4);
                        uVar18 = uVar18 + 1;
                      } while (uVar28 != (uint)uVar18);
                    }
                  }
                  else if (depth == 2) {
                    if (uVar28 != 0) {
                      uVar18 = 0;
                      uVar17 = 0;
                      do {
                        if ((uVar18 & 3) == 0) {
                          uVar17 = (ulong)(byte)*src;
                          src = (ushort *)((long)src + 1);
                        }
                        psVar8[uVar18 + uVar30] = (char)(uVar17 >> 6) * bVar12;
                        uVar17 = (ulong)(byte)((char)uVar17 << 2);
                        uVar18 = uVar18 + 1;
                      } while (uVar28 != (uint)uVar18);
                    }
                  }
                  else if (uVar28 != 0) {
                    uVar18 = 0;
                    bVar15 = 0;
                    do {
                      if ((uVar18 & 7) == 0) {
                        bVar15 = (byte)*src;
                        src = (ushort *)((long)src + 1);
                      }
                      psVar8[uVar18 + uVar30] = (char)bVar15 >> 7 & bVar12;
                      bVar15 = bVar15 * '\x02';
                      uVar18 = uVar18 + 1;
                    } while (uVar28 != (uint)uVar18);
                  }
                  if (a_00 != out_n) {
                    stbi__create_png_alpha_expand8(dest,dest,x,a_00);
                  }
                }
                else if (depth == 8) {
                  if (a_00 == out_n) {
                    memcpy(dest,src,(ulong)uVar28);
                  }
                  else {
                    stbi__create_png_alpha_expand8(dest,(stbi_uc *)src,x,a_00);
                  }
                }
                else if (depth == 0x10) {
                  if (a_00 == out_n) {
                    if (uVar28 != 0) {
                      lVar11 = 0;
                      do {
                        *(ushort *)(psVar8 + lVar11 * 2 + uVar30) =
                             src[lVar11] << 8 | src[lVar11] >> 8;
                        lVar11 = lVar11 + 1;
                      } while (uVar28 != (uint)lVar11);
                    }
                  }
                  else if (a_00 == 1) {
                    if (x != 0) {
                      lVar11 = 0;
                      do {
                        *(ushort *)(psVar8 + lVar11 * 4 + uVar30) =
                             src[lVar11] << 8 | src[lVar11] >> 8;
                        (psVar8 + lVar11 * 4 + uVar30 + 2)[0] = 0xff;
                        (psVar8 + lVar11 * 4 + uVar30 + 2)[1] = 0xff;
                        lVar11 = lVar11 + 1;
                      } while (x != (stbi__uint32)lVar11);
                    }
                  }
                  else if (x != 0) {
                    lVar11 = 0;
                    do {
                      *(ushort *)(psVar8 + lVar11 * 8 + uVar30) = *src << 8 | *src >> 8;
                      *(ushort *)(psVar8 + lVar11 * 8 + uVar30 + 2) = src[1] << 8 | src[1] >> 8;
                      *(ushort *)(psVar8 + lVar11 * 8 + uVar30 + 4) = src[2] << 8 | src[2] >> 8;
                      (psVar8 + lVar11 * 8 + uVar30 + 6)[0] = 0xff;
                      (psVar8 + lVar11 * 8 + uVar30 + 6)[1] = 0xff;
                      src = src + 3;
                      lVar11 = lVar11 + 1;
                    } while (x != (stbi__uint32)lVar11);
                  }
                }
              }
              else {
                *(char **)(lVar2 + -0x20) = "invalid filter";
                bVar4 = 0;
              }
              if (4 < bVar1) break;
              uVar27 = uVar27 + 1;
              bVar23 = bVar23 + 1;
              uVar29 = uVar29 + iVar5;
              raw = __src;
            } while (uVar27 != y);
            uVar26 = (uint)bVar4;
          }
          free(__ptr);
          return uVar26;
        }
        lVar9 = *in_FS_OFFSET;
        pcVar13 = "outofmem";
      }
      goto LAB_00141881;
    }
  }
  lVar9 = *in_FS_OFFSET;
  pcVar13 = "too large";
LAB_00141881:
  *(char **)(lVar9 + -0x20) = pcVar13;
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16 ? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   stbi_uc *filter_buf;
   int all_ok = 1;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   // note: error exits here don't need to clean up a->out individually,
   // stbi__do_png always does on error.
   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   if (!stbi__mad2sizes_valid(img_width_bytes, y, img_width_bytes)) return stbi__err("too large", "Corrupt PNG");
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   // Allocate two scan lines worth of filter workspace buffer.
   filter_buf = (stbi_uc *) stbi__malloc_mad2(img_width_bytes, 2, 0);
   if (!filter_buf) return stbi__err("outofmem", "Out of memory");

   // Filtering for low-bit-depth images
   if (depth < 8) {
      filter_bytes = 1;
      width = img_width_bytes;
   }

   for (j=0; j < y; ++j) {
      // cur/prior filter buffers alternate
      stbi_uc *cur = filter_buf + (j & 1)*img_width_bytes;
      stbi_uc *prior = filter_buf + (~j & 1)*img_width_bytes;
      stbi_uc *dest = a->out + stride*j;
      int nk = width * filter_bytes;
      int filter = *raw++;

      // check filter type
      if (filter > 4) {
         all_ok = stbi__err("invalid filter","Corrupt PNG");
         break;
      }

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // perform actual filtering
      switch (filter) {
      case STBI__F_none:
         memcpy(cur, raw, nk);
         break;
      case STBI__F_sub:
         memcpy(cur, raw, filter_bytes);
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]);
         break;
      case STBI__F_up:
         for (k = 0; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + prior[k]);
         break;
      case STBI__F_avg:
         for (k = 0; k < filter_bytes; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1));
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1));
         break;
      case STBI__F_paeth:
         for (k = 0; k < filter_bytes; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + prior[k]); // prior[k] == stbi__paeth(0,prior[k],0)
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes], prior[k], prior[k-filter_bytes]));
         break;
      case STBI__F_avg_first:
         memcpy(cur, raw, filter_bytes);
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1));
         break;
      }

      raw += nk;

      // expand decoded bits in cur to dest, also adding an extra alpha channel if desired
      if (depth < 8) {
         stbi_uc scale = (color == 0) ? stbi__depth_scale_table[depth] : 1; // scale grayscale values to 0..255 range
         stbi_uc *in = cur;
         stbi_uc *out = dest;
         stbi_uc inb = 0;
         stbi__uint32 nsmp = x*img_n;

         // expand bits to bytes first
         if (depth == 4) {
            for (i=0; i < nsmp; ++i) {
               if ((i & 1) == 0) inb = *in++;
               *out++ = scale * (inb >> 4);
               inb <<= 4;
            }
         } else if (depth == 2) {
            for (i=0; i < nsmp; ++i) {
               if ((i & 3) == 0) inb = *in++;
               *out++ = scale * (inb >> 6);
               inb <<= 2;
            }
         } else {
            STBI_ASSERT(depth == 1);
            for (i=0; i < nsmp; ++i) {
               if ((i & 7) == 0) inb = *in++;
               *out++ = scale * (inb >> 7);
               inb <<= 1;
            }
         }

         // insert alpha=255 values if desired
         if (img_n != out_n)
            stbi__create_png_alpha_expand8(dest, dest, x, img_n);
      } else if (depth == 8) {
         if (img_n == out_n)
            memcpy(dest, cur, x*img_n);
         else
            stbi__create_png_alpha_expand8(dest, cur, x, img_n);
      } else if (depth == 16) {
         // convert the image data from big-endian to platform-native
         stbi__uint16 *dest16 = (stbi__uint16*)dest;
         stbi__uint32 nsmp = x*img_n;

         if (img_n == out_n) {
            for (i = 0; i < nsmp; ++i, ++dest16, cur += 2)
               *dest16 = (cur[0] << 8) | cur[1];
         } else {
            STBI_ASSERT(img_n+1 == out_n);
            if (img_n == 1) {
               for (i = 0; i < x; ++i, dest16 += 2, cur += 2) {
                  dest16[0] = (cur[0] << 8) | cur[1];
                  dest16[1] = 0xffff;
               }
            } else {
               STBI_ASSERT(img_n == 3);
               for (i = 0; i < x; ++i, dest16 += 4, cur += 6) {
                  dest16[0] = (cur[0] << 8) | cur[1];
                  dest16[1] = (cur[2] << 8) | cur[3];
                  dest16[2] = (cur[4] << 8) | cur[5];
                  dest16[3] = 0xffff;
               }
            }
         }
      }
   }

   STBI_FREE(filter_buf);
   if (!all_ok) return 0;

   return 1;
}